

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlcrc.c
# Opt level: O0

bool_t EBML_CRCMatches(ebml_crc *CRC,void *Buf,size_t Size)

{
  uint uVar1;
  byte *local_38;
  uint8_t *Buf8;
  uint32_t *Buf32;
  ulong uStack_20;
  uint32_t testCRC;
  size_t Size_local;
  void *Buf_local;
  ebml_crc *CRC_local;
  
  Buf32._4_4_ = 0xffffffff;
  Buf8 = (uint8_t *)Buf;
  uStack_20 = Size;
  if ((CRC->Base).bValueIsSet == '\0') {
    __assert_fail("CRC->Base.bValueIsSet",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlcrc.c"
                  ,0xd6,"bool_t EBML_CRCMatches(ebml_crc *, const void *, size_t)");
  }
  for (; 3 < uStack_20; uStack_20 = uStack_20 - 4) {
    uVar1 = m_tab[(*(uint *)Buf8 ^ Buf32._4_4_) & 0xff] ^ (*(uint *)Buf8 ^ Buf32._4_4_) >> 8;
    uVar1 = m_tab[uVar1 & 0xff] ^ uVar1 >> 8;
    uVar1 = m_tab[uVar1 & 0xff] ^ uVar1 >> 8;
    Buf32._4_4_ = m_tab[uVar1 & 0xff] ^ uVar1 >> 8;
    Buf8 = Buf8 + 4;
  }
  local_38 = Buf8;
  while (uStack_20 != 0) {
    Buf32._4_4_ = m_tab[Buf32._4_4_ & 0xff ^ (uint)*local_38] ^ Buf32._4_4_ >> 8;
    local_38 = local_38 + 1;
    uStack_20 = uStack_20 - 1;
  }
  return (long)(int)(uint)(CRC->CRC == (Buf32._4_4_ ^ 0xffffffff));
}

Assistant:

META_END(EBML_ELEMENT_CLASS)

bool_t EBML_CRCMatches(ebml_crc *CRC, const void *Buf, size_t Size)
{
    uint32_t testCRC = CRC32_NEGL;

    assert(CRC->Base.bValueIsSet);

/* TODO: needed for non aligned memory ?
	for(; !aligned(Buf) && Size > 0; Size--)
		testCRC = m_tab[CRC32_INDEX(testCRC) ^ *Buf++] ^ CRC32_SHIFTED(testCRC);
*/
	const uint32_t *Buf32 = Buf;
	while (Size >= 4)
	{
		testCRC ^= *Buf32;
		testCRC = m_tab[CRC32_INDEX(testCRC)] ^ CRC32_SHIFTED(testCRC);
		testCRC = m_tab[CRC32_INDEX(testCRC)] ^ CRC32_SHIFTED(testCRC);
		testCRC = m_tab[CRC32_INDEX(testCRC)] ^ CRC32_SHIFTED(testCRC);
		testCRC = m_tab[CRC32_INDEX(testCRC)] ^ CRC32_SHIFTED(testCRC);
		Size -= 4;
		Buf32++;
	}

	const uint8_t *Buf8 = (const uint8_t *)Buf32;
	while (Size--)
		testCRC = m_tab[CRC32_INDEX(testCRC) ^ *Buf8++] ^ CRC32_SHIFTED(testCRC);

	testCRC ^= CRC32_NEGL;

    return (CRC->CRC == testCRC);
}